

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

void __thiscall btCollisionWorldImporter::deleteAllData(btCollisionWorldImporter *this)

{
  long *plVar1;
  btStridingMeshInterfaceData *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  btCollisionObject **ppbVar6;
  btCollisionShape **ppbVar7;
  btOptimizedBvh **ppbVar8;
  btTriangleInfoMap **ppbVar9;
  btTriangleIndexVertexArray **ppbVar10;
  char **ppcVar11;
  btStridingMeshInterfaceData **ppbVar12;
  btMeshPartData *pbVar13;
  long in_RDI;
  btMeshPartData *curPart;
  int a;
  btStridingMeshInterfaceData *curData;
  int i;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_1c;
  int local_c;
  
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<btCollisionObject_*>::size
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0xd8)),
      local_c < iVar3; local_c = local_c + 1) {
    if (*(long *)(in_RDI + 8) != 0) {
      plVar1 = *(long **)(in_RDI + 8);
      ppbVar6 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                          ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0xd8),local_c);
      (**(code **)(*plVar1 + 0x50))(plVar1,*ppbVar6);
    }
    ppbVar6 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0xd8),local_c);
    if (*ppbVar6 != (btCollisionObject *)0x0) {
      (*(*ppbVar6)->_vptr_btCollisionObject[1])();
    }
  }
  btAlignedObjectArray<btCollisionObject_*>::clear
            ((btAlignedObjectArray<btCollisionObject_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<btCollisionShape_*>::size
                        ((btAlignedObjectArray<btCollisionShape_*> *)(in_RDI + 0x18)),
      local_c < iVar3; local_c = local_c + 1) {
    ppbVar7 = btAlignedObjectArray<btCollisionShape_*>::operator[]
                        ((btAlignedObjectArray<btCollisionShape_*> *)(in_RDI + 0x18),local_c);
    if (*ppbVar7 != (btCollisionShape *)0x0) {
      (*(*ppbVar7)->_vptr_btCollisionShape[1])();
    }
  }
  btAlignedObjectArray<btCollisionShape_*>::clear
            ((btAlignedObjectArray<btCollisionShape_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<btOptimizedBvh_*>::size
                        ((btAlignedObjectArray<btOptimizedBvh_*> *)(in_RDI + 0x58)), local_c < iVar3
      ; local_c = local_c + 1) {
    ppbVar8 = btAlignedObjectArray<btOptimizedBvh_*>::operator[]
                        ((btAlignedObjectArray<btOptimizedBvh_*> *)(in_RDI + 0x58),local_c);
    if (*ppbVar8 != (btOptimizedBvh *)0x0) {
      (*((*ppbVar8)->super_btQuantizedBvh)._vptr_btQuantizedBvh[1])();
    }
  }
  btAlignedObjectArray<btOptimizedBvh_*>::clear
            ((btAlignedObjectArray<btOptimizedBvh_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<btTriangleInfoMap_*>::size
                        ((btAlignedObjectArray<btTriangleInfoMap_*> *)(in_RDI + 0x78)),
      local_c < iVar3; local_c = local_c + 1) {
    ppbVar9 = btAlignedObjectArray<btTriangleInfoMap_*>::operator[]
                        ((btAlignedObjectArray<btTriangleInfoMap_*> *)(in_RDI + 0x78),local_c);
    if (*ppbVar9 != (btTriangleInfoMap *)0x0) {
      (*(*ppbVar9)->_vptr_btTriangleInfoMap[1])();
    }
  }
  btAlignedObjectArray<btTriangleInfoMap_*>::clear
            ((btAlignedObjectArray<btTriangleInfoMap_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<btTriangleIndexVertexArray_*>::size
                        ((btAlignedObjectArray<btTriangleIndexVertexArray_*> *)(in_RDI + 0x98)),
      local_c < iVar3; local_c = local_c + 1) {
    ppbVar10 = btAlignedObjectArray<btTriangleIndexVertexArray_*>::operator[]
                         ((btAlignedObjectArray<btTriangleIndexVertexArray_*> *)(in_RDI + 0x98),
                          local_c);
    if (*ppbVar10 != (btTriangleIndexVertexArray *)0x0) {
      (*((*ppbVar10)->super_btStridingMeshInterface)._vptr_btStridingMeshInterface[1])();
    }
  }
  btAlignedObjectArray<btTriangleIndexVertexArray_*>::clear
            ((btAlignedObjectArray<btTriangleIndexVertexArray_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<char_*>::size((btAlignedObjectArray<char_*> *)(in_RDI + 0xf8)),
      local_c < iVar3; local_c = local_c + 1) {
    ppcVar11 = btAlignedObjectArray<char_*>::operator[]
                         ((btAlignedObjectArray<char_*> *)(in_RDI + 0xf8),local_c);
    if (*ppcVar11 != (char *)0x0) {
      operator_delete__(*ppcVar11);
    }
  }
  btAlignedObjectArray<char_*>::clear
            ((btAlignedObjectArray<char_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<btStridingMeshInterfaceData_*>::size
                        ((btAlignedObjectArray<btStridingMeshInterfaceData_*> *)(in_RDI + 0xb8)),
      local_c < iVar3; local_c = local_c + 1) {
    ppbVar12 = btAlignedObjectArray<btStridingMeshInterfaceData_*>::operator[]
                         ((btAlignedObjectArray<btStridingMeshInterfaceData_*> *)(in_RDI + 0xb8),
                          local_c);
    pbVar2 = *ppbVar12;
    for (local_1c = 0; local_1c < pbVar2->m_numMeshParts; local_1c = local_1c + 1) {
      pbVar13 = pbVar2->m_meshPartsPtr + local_1c;
      if ((pbVar13->m_vertices3f != (btVector3FloatData *)0x0) &&
         (pbVar13->m_vertices3f != (btVector3FloatData *)0x0)) {
        operator_delete__(pbVar13->m_vertices3f);
      }
      if ((pbVar13->m_vertices3d != (btVector3DoubleData *)0x0) &&
         (pbVar13->m_vertices3d != (btVector3DoubleData *)0x0)) {
        operator_delete__(pbVar13->m_vertices3d);
      }
      if ((pbVar13->m_indices32 != (btIntIndexData *)0x0) &&
         (pbVar13->m_indices32 != (btIntIndexData *)0x0)) {
        operator_delete__(pbVar13->m_indices32);
      }
      if ((pbVar13->m_3indices16 != (btShortIntIndexTripletData *)0x0) &&
         (pbVar13->m_3indices16 != (btShortIntIndexTripletData *)0x0)) {
        operator_delete__(pbVar13->m_3indices16);
      }
      if ((pbVar13->m_indices16 != (btShortIntIndexData *)0x0) &&
         (pbVar13->m_indices16 != (btShortIntIndexData *)0x0)) {
        operator_delete__(pbVar13->m_indices16);
      }
      if ((pbVar13->m_3indices8 != (btCharIndexTripletData *)0x0) &&
         (pbVar13->m_3indices8 != (btCharIndexTripletData *)0x0)) {
        operator_delete__(pbVar13->m_3indices8);
      }
    }
    if (pbVar2->m_meshPartsPtr != (btMeshPartData *)0x0) {
      operator_delete__(pbVar2->m_meshPartsPtr);
    }
    if (pbVar2 != (btStridingMeshInterfaceData *)0x0) {
      ::operator_delete(pbVar2);
    }
  }
  btAlignedObjectArray<btStridingMeshInterfaceData_*>::clear
            ((btAlignedObjectArray<btStridingMeshInterfaceData_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<int_*>::size((btAlignedObjectArray<int_*> *)(in_RDI + 0x118)),
      local_c < iVar3; local_c = local_c + 1) {
    btAlignedObjectArray<int_*>::operator[]((btAlignedObjectArray<int_*> *)(in_RDI + 0x118),local_c)
    ;
    btAlignedFreeInternal((void *)0x1863fc);
  }
  btAlignedObjectArray<int_*>::clear
            ((btAlignedObjectArray<int_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (local_c = 0;
      iVar3 = btAlignedObjectArray<short_*>::size((btAlignedObjectArray<short_*> *)(in_RDI + 0x138))
      , local_c < iVar3; local_c = local_c + 1) {
    btAlignedObjectArray<short_*>::operator[]
              ((btAlignedObjectArray<short_*> *)(in_RDI + 0x138),local_c);
    btAlignedFreeInternal((void *)0x18647a);
  }
  btAlignedObjectArray<short_*>::clear
            ((btAlignedObjectArray<short_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_c = 0;
  while (iVar3 = local_c,
        iVar4 = btAlignedObjectArray<unsigned_char_*>::size
                          ((btAlignedObjectArray<unsigned_char_*> *)(in_RDI + 0x158)), iVar3 < iVar4
        ) {
    btAlignedObjectArray<unsigned_char_*>::operator[]
              ((btAlignedObjectArray<unsigned_char_*> *)(in_RDI + 0x158),local_c);
    btAlignedFreeInternal((void *)0x1864f8);
    local_c = local_c + 1;
  }
  btAlignedObjectArray<unsigned_char_*>::clear
            ((btAlignedObjectArray<unsigned_char_*> *)CONCAT44(iVar3,in_stack_ffffffffffffff10));
  local_c = 0;
  while (iVar4 = local_c,
        iVar5 = btAlignedObjectArray<btVector3FloatData_*>::size
                          ((btAlignedObjectArray<btVector3FloatData_*> *)(in_RDI + 0x178)),
        iVar4 < iVar5) {
    btAlignedObjectArray<btVector3FloatData_*>::operator[]
              ((btAlignedObjectArray<btVector3FloatData_*> *)(in_RDI + 0x178),local_c);
    btAlignedFreeInternal((void *)0x186576);
    local_c = local_c + 1;
  }
  btAlignedObjectArray<btVector3FloatData_*>::clear
            ((btAlignedObjectArray<btVector3FloatData_*> *)CONCAT44(iVar3,iVar4));
  for (local_c = 0;
      iVar5 = btAlignedObjectArray<btVector3DoubleData_*>::size
                        ((btAlignedObjectArray<btVector3DoubleData_*> *)(in_RDI + 0x198)),
      local_c < iVar5; local_c = local_c + 1) {
    btAlignedObjectArray<btVector3DoubleData_*>::operator[]
              ((btAlignedObjectArray<btVector3DoubleData_*> *)(in_RDI + 0x198),local_c);
    btAlignedFreeInternal((void *)0x1865f4);
  }
  btAlignedObjectArray<btVector3DoubleData_*>::clear
            ((btAlignedObjectArray<btVector3DoubleData_*> *)CONCAT44(iVar3,iVar4));
  return;
}

Assistant:

void btCollisionWorldImporter::deleteAllData()
{
	int i;

	for (i=0;i<m_allocatedCollisionObjects.size();i++)
	{
		if(m_collisionWorld)
			m_collisionWorld->removeCollisionObject(m_allocatedCollisionObjects[i]);
		delete m_allocatedCollisionObjects[i];
	}

	m_allocatedCollisionObjects.clear();


	for (i=0;i<m_allocatedCollisionShapes.size();i++)
	{
		delete m_allocatedCollisionShapes[i];
	}
	m_allocatedCollisionShapes.clear();


	for (i=0;i<m_allocatedBvhs.size();i++)
	{
		delete m_allocatedBvhs[i];
	}
	m_allocatedBvhs.clear();

	for (i=0;i<m_allocatedTriangleInfoMaps.size();i++)
	{
		delete m_allocatedTriangleInfoMaps[i];
	}
	m_allocatedTriangleInfoMaps.clear();
	for (i=0;i<m_allocatedTriangleIndexArrays.size();i++)
	{
		delete m_allocatedTriangleIndexArrays[i];
	}
	m_allocatedTriangleIndexArrays.clear();
	for (i=0;i<m_allocatedNames.size();i++)
	{
		delete[] m_allocatedNames[i];
	}
	m_allocatedNames.clear();

	for (i=0;i<m_allocatedbtStridingMeshInterfaceDatas.size();i++)
	{
		btStridingMeshInterfaceData* curData = m_allocatedbtStridingMeshInterfaceDatas[i];

		for(int a = 0;a < curData->m_numMeshParts;a++)
		{
			btMeshPartData* curPart = &curData->m_meshPartsPtr[a];
			if(curPart->m_vertices3f)
				delete [] curPart->m_vertices3f;

			if(curPart->m_vertices3d)
				delete [] curPart->m_vertices3d;

			if(curPart->m_indices32)
				delete [] curPart->m_indices32;

			if(curPart->m_3indices16)
				delete [] curPart->m_3indices16;

			if(curPart->m_indices16)
				delete [] curPart->m_indices16;

			if (curPart->m_3indices8)
				delete [] curPart->m_3indices8;

		}
		delete [] curData->m_meshPartsPtr;
		delete curData;
	}
	m_allocatedbtStridingMeshInterfaceDatas.clear();

	for (i=0;i<m_indexArrays.size();i++)
	{
		btAlignedFree(m_indexArrays[i]);
	}
  m_indexArrays.clear();

	for (i=0;i<m_shortIndexArrays.size();i++)
	{
		btAlignedFree(m_shortIndexArrays[i]);
	}
  m_shortIndexArrays.clear();

	for (i=0;i<m_charIndexArrays.size();i++)
	{
		btAlignedFree(m_charIndexArrays[i]);
	}
  m_charIndexArrays.clear();

	for (i=0;i<m_floatVertexArrays.size();i++)
	{
		btAlignedFree(m_floatVertexArrays[i]);
	}
  m_floatVertexArrays.clear();

	for (i=0;i<m_doubleVertexArrays.size();i++)
	{
		btAlignedFree(m_doubleVertexArrays[i]);
	}
   m_doubleVertexArrays.clear();


}